

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

string * __thiscall
slang::TimeScale::toString_abi_cxx11_(string *__return_storage_ptr__,TimeScale *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  char *local_100;
  TimeScale *local_f8;
  TimeScale *this_local;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined1 local_c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  char *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  string *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  string *local_88;
  char *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  char *pcStack_60;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  char *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_18;
  char *local_10;
  
  local_78 = &local_108;
  local_80 = "{} / {}";
  local_20 = "{} / {}";
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x720129;
  local_f8 = this;
  this_local = (TimeScale *)__return_storage_ptr__;
  local_18 = local_78;
  local_100 = (char *)std::char_traits<char>::length("{} / {}");
  local_10 = local_80;
  TimeScaleValue::toString_abi_cxx11_(&local_128,&this->base);
  TimeScaleValue::toString_abi_cxx11_(&local_148,&this->precision);
  local_98 = local_108;
  pcStack_90 = local_100;
  local_a0 = &local_128;
  local_a8 = &local_148;
  local_70 = &local_98;
  local_b8 = local_108;
  local_b0 = local_100;
  local_88 = __return_storage_ptr__;
  local_68 = local_b8;
  pcStack_60 = local_b0;
  ::fmt::v9::
  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,std::__cxx11::string&>
            (&local_e8,(v9 *)local_a0,local_a8,local_108);
  local_48 = local_c8;
  local_50 = &local_e8;
  local_30 = 0xdd;
  fmt.size_ = 0xdd;
  fmt.data_ = local_b0;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_50;
  local_40 = local_50;
  local_38 = local_50;
  local_28 = local_48;
  ::fmt::v9::vformat_abi_cxx11_(__return_storage_ptr__,(v9 *)local_b8,fmt,args);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeScale::toString() const {
    return fmt::format("{} / {}", base.toString(), precision.toString());
}